

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.h
# Opt level: O1

uintmax_t __thiscall pstack::Dwarf::DWARFReader::getuint(DWARFReader *this,size_t len)

{
  uintmax_t uVar1;
  Exception *this_00;
  Exception local_1d8;
  uchar local_38 [8];
  uint8_t bytes [16];
  
  if (0x10 < len) {
    this_00 = (Exception *)__cxa_allocate_exception(0x1a0);
    memset(&local_1d8,0,0x1a0);
    Exception::Exception(&local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str,"can\'t deal with ints of size ",0x1d);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1d8.str);
    Exception::Exception(this_00,&local_1d8);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  Reader::readObj<unsigned_char>
            ((this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             this->off,local_38,len);
  this->off = this->off + len;
  if (len == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    do {
      uVar1 = (ulong)local_38[len - 1] | uVar1 << 8;
      len = len - 1;
    } while (len != 0);
  }
  return uVar1;
}

Assistant:

uintmax_t getuint(size_t len) {
        uintmax_t rc = 0;
        uint8_t bytes[16];
        if (len > 16)
            throw Exception() << "can't deal with ints of size " << len;
        io->readObj(off, bytes, len);
        off += len;
        uint8_t *p = bytes + len;
        for (size_t i = 1; i <= len; i++)
            rc = rc << 8 | p[-i];
        return rc;
    }